

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O0

void fwd_txfm2d_64x64_sse4_1
               (int16_t *input,int32_t *output,int stride,TXFM_2D_FLIP_CFG *cfg,int32_t *txfm_buf)

{
  byte bVar1;
  int txfm1d_size;
  int iVar2;
  int size;
  TxfmFuncSSE2 p_Var3;
  byte *in_RCX;
  int in_EDX;
  __m128i *in_RSI;
  int16_t *in_RDI;
  __m128i *in_R8;
  int col;
  int col_num;
  int txfm2d_size_128;
  int num_per_128;
  __m128i *out_128;
  __m128i *buf_128;
  TxfmFuncSSE2 txfm_func_col;
  int8_t cos_bit_row;
  int8_t cos_bit_col;
  int8_t *stage_range_col;
  int8_t *shift;
  int txfm_size;
  int in_stack_000040d4;
  int in_stack_000040d8;
  int8_t in_stack_000040df;
  __m128i *in_stack_000040e0;
  __m128i *in_stack_000040e8;
  int in_stack_ffffffffffffff90;
  undefined4 uVar4;
  int txfm_size_00;
  
  txfm1d_size = tx_size_wide[*in_RCX];
  bVar1 = in_RCX[0x18];
  p_Var3 = fwd_txfm_type_to_func(in_RCX[0x32]);
  uVar4 = 4;
  iVar2 = (txfm1d_size * txfm1d_size) / 4;
  size = txfm1d_size / 4;
  int16_array_with_stride_to_int32_array_without_stride(in_RDI,in_EDX,(int32_t *)in_RSI,txfm1d_size)
  ;
  (*p_Var3)(in_RSI,in_R8,bVar1,(int8_t *)(in_RCX + 0x1a));
  txfm_size_00 = (int)((ulong)p_Var3 >> 0x20);
  av1_round_shift_array_32_sse4_1
            (in_RSI,(__m128i *)CONCAT44(uVar4,iVar2),size,in_stack_ffffffffffffff90);
  transpose_32(txfm_size_00,in_R8,in_RSI);
  for (iVar2 = 0; iVar2 < size >> 1; iVar2 = iVar2 + 1) {
    av1_fdct64_sse4_1(in_stack_000040e8,in_stack_000040e0,in_stack_000040df,in_stack_000040d8,
                      in_stack_000040d4);
  }
  av1_round_shift_array_32_sse4_1
            (in_RSI,(__m128i *)CONCAT44(uVar4,(size >> 1) * (txfm1d_size >> 1)),size,iVar2);
  return;
}

Assistant:

static inline void fwd_txfm2d_64x64_sse4_1(const int16_t *input,
                                           int32_t *output, const int stride,
                                           const TXFM_2D_FLIP_CFG *cfg,
                                           int32_t *txfm_buf) {
  assert(cfg->tx_size < TX_SIZES);
  const int txfm_size = tx_size_wide[cfg->tx_size];
  const int8_t *shift = cfg->shift;
  const int8_t *stage_range_col = cfg->stage_range_col;
  const int8_t cos_bit_col = cfg->cos_bit_col;
  const int8_t cos_bit_row = cfg->cos_bit_row;
  const TxfmFuncSSE2 txfm_func_col = fwd_txfm_type_to_func(cfg->txfm_type_col);
  __m128i *buf_128 = (__m128i *)txfm_buf;
  __m128i *out_128 = (__m128i *)output;

  const int num_per_128 = 4;
  int txfm2d_size_128 = txfm_size * txfm_size / num_per_128;
  int col_num = txfm_size / num_per_128;

  int16_array_with_stride_to_int32_array_without_stride(input, stride, output,
                                                        txfm_size);
  /*col wise transform*/
  txfm_func_col(out_128, buf_128, cos_bit_col, stage_range_col);
  av1_round_shift_array_32_sse4_1(buf_128, out_128, txfm2d_size_128, -shift[1]);
  transpose_32(txfm_size, out_128, buf_128);

  /*row wise transform*/
  for (int col = 0; col < (col_num >> 1); col++) {
    av1_fdct64_sse4_1((buf_128 + col), (out_128 + col), cos_bit_row, col_num,
                      (col_num >> 1));
  }

  txfm2d_size_128 = (col_num >> 1) * (txfm_size >> 1);
  av1_round_shift_array_32_sse4_1(out_128, out_128, txfm2d_size_128, -shift[2]);
}